

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_notifyforscalar
               (t_template *template,_glist *owner,t_scalar *sc,t_symbol *s,int argc,t_atom *argv)

{
  undefined1 local_50 [8];
  t_gpointer gp;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_scalar *sc_local;
  _glist *owner_local;
  t_template *template_local;
  
  gp.gp_stub = (t_gstub *)argv;
  gpointer_init((t_gpointer *)local_50);
  gpointer_setglist((t_gpointer *)local_50,owner,sc);
  *(undefined4 *)&(gp.gp_stub)->gs_un = 3;
  *(undefined1 **)&(gp.gp_stub)->gs_which = local_50;
  template_notify(template,s,argc,(t_atom *)gp.gp_stub);
  gpointer_unset((t_gpointer *)local_50);
  return;
}

Assistant:

void template_notifyforscalar(t_template *template, t_glist *owner,
    t_scalar *sc, t_symbol *s, int argc, t_atom *argv)
{
    t_gpointer gp;
    gpointer_init(&gp);
    gpointer_setglist(&gp, owner, sc);
    SETPOINTER(argv, &gp);
    template_notify(template, s, argc, argv);
    gpointer_unset(&gp);
}